

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

uint32 google::protobuf::internal::DecodeTwoBytes(char **ptr)

{
  ushort uVar1;
  uint uVar2;
  
  uVar1 = *(ushort *)*ptr;
  uVar2 = (uint)(char)uVar1;
  *ptr = (char *)((long)*ptr + (ulong)CARRY4((uint)uVar1,uVar2) + 1);
  return uVar2 * 2 & uVar1 + uVar2;
}

Assistant:

inline uint32 DecodeTwoBytes(const char** ptr) {
  uint32 value = UnalignedLoad<uint16>(*ptr);
  // Sign extend the low byte continuation bit
  uint32_t x = static_cast<int8_t>(value);
  // This add is an amazing operation, it cancels the low byte continuation bit
  // from y transferring it to the carry. Simultaneously it also shifts the 7
  // LSB left by one tightly against high byte varint bits. Hence value now
  // contains the unpacked value shifted left by 1.
  value += x;
  // Use the carry to update the ptr appropriately.
  *ptr += value < x ? 2 : 1;
  return value & (x + x);  // Mask out the high byte iff no continuation
}